

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

void __thiscall indigox::Molecule::ResetIndices(Molecule *this)

{
  size_type sVar1;
  element_type *this_00;
  unsigned_long *puVar2;
  element_type *this_01;
  shared_ptr<indigox::Bond> *__args_1;
  long in_RDI;
  uid_t i_1;
  uid_t i;
  shared_ptr<indigox::Atom> *in_stack_ffffffffffffffa0;
  unsigned_long *in_stack_ffffffffffffffa8;
  unsigned_long *__args;
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
  *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined8 local_10;
  
  std::
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
  ::clear((unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
           *)0x110d9c);
  local_10 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
            ::size((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                    *)(in_RDI + 0x40));
    if (sVar1 <= local_10) break;
    std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
    operator[]((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                *)(in_RDI + 0x40),local_10);
    this_00 = std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x110de5);
    Atom::SetIndex(this_00,local_10);
    in_stack_ffffffffffffffb0 =
         (unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
          *)(in_RDI + 0x70);
    std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
    operator[]((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                *)(in_RDI + 0x40),local_10);
    std::
    unordered_map<unsigned_long,std::weak_ptr<indigox::Atom>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>>
    ::emplace<unsigned_long&,std::shared_ptr<indigox::Atom>&>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_10 = local_10 + 1;
  }
  std::
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
  ::clear((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
           *)0x110e50);
  local_28 = (unsigned_long *)0x0;
  while( true ) {
    __args = local_28;
    puVar2 = (unsigned_long *)
             std::
             vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
             ::size((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                     *)(in_RDI + 0x58));
    if (puVar2 <= __args) break;
    std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
    operator[]((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                *)(in_RDI + 0x58),(size_type)local_28);
    this_01 = std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x110e99);
    Bond::SetIndex(this_01,(uid_t)local_28);
    __args_1 = (shared_ptr<indigox::Bond> *)(in_RDI + 0xa8);
    std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
    operator[]((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                *)(in_RDI + 0x58),(size_type)local_28);
    std::
    unordered_map<unsigned_long,std::weak_ptr<indigox::Bond>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>>
    ::emplace<unsigned_long&,std::shared_ptr<indigox::Bond>&>
              ((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
                *)in_stack_ffffffffffffffb0,__args,__args_1);
    local_28 = (unsigned_long *)((long)local_28 + 1);
  }
  return;
}

Assistant:

void Molecule::ResetIndices() {
  idx_to_atom_.clear();
  for (uid_t i = 0; i < atoms_.size(); ++i) {
    atoms_[i]->SetIndex(i);
    idx_to_atom_.emplace(i, atoms_[i]);
  }
  
  idx_to_bond_.clear();
  for (uid_t i = 0; i < bonds_.size(); ++i) {
    bonds_[i]->SetIndex(i);
    idx_to_bond_.emplace(i, bonds_[i]);
  }
}